

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.c
# Opt level: O1

_Bool ra_portable_deserialize(roaring_array_t *answer,char *buf,size_t maxbytes,size_t *readbytes)

{
  ushort uVar1;
  size_t sVar2;
  uint16_t *puVar3;
  bool bVar4;
  uint uVar5;
  _Bool _Var6;
  int32_t iVar7;
  bitset_container_t *container;
  run_container_t *container_00;
  array_container_t *container_01;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  uint uVar14;
  int size;
  bool bVar15;
  ushort *local_50;
  char *local_40;
  
  *readbytes = 4;
  if (3 < maxbytes) {
    uVar14 = *(uint *)buf;
    uVar9 = uVar14 & 0xffff;
    if (uVar14 == 0x303a || uVar9 == 0x303b) {
      if (uVar9 == 0x303b) {
        pcVar12 = buf + 4;
        uVar14 = (uVar14 >> 0x10) + 1;
      }
      else {
        *readbytes = 8;
        if (maxbytes < 8) {
          return false;
        }
        uVar14 = *(uint *)(buf + 4);
        pcVar12 = buf + 8;
      }
      if (uVar14 < 0x10001) {
        if (uVar9 == 0x303b) {
          uVar11 = (ulong)(uVar14 + 7 >> 3);
          uVar8 = *readbytes + uVar11;
          *readbytes = uVar8;
          if (maxbytes < uVar8) {
            return false;
          }
          pcVar13 = pcVar12 + uVar11;
          local_40 = pcVar12;
        }
        else {
          local_40 = (char *)0x0;
          pcVar13 = pcVar12;
        }
        uVar11 = (ulong)(uVar14 * 4);
        sVar2 = *readbytes;
        *readbytes = sVar2 + uVar11;
        if ((sVar2 + uVar11 <= maxbytes) && (_Var6 = ra_init_with_capacity(answer,uVar14), _Var6)) {
          if (uVar14 != 0) {
            puVar3 = answer->keys;
            uVar8 = 1;
            if (1 < (int)uVar14) {
              uVar8 = (ulong)uVar14;
            }
            uVar10 = 0;
            do {
              puVar3[uVar10] = *(uint16_t *)(pcVar13 + uVar10 * 4);
              uVar10 = uVar10 + 1;
            } while (uVar8 != uVar10);
          }
          local_50 = (ushort *)(pcVar13 + uVar11);
          if (3 < (int)uVar14 || uVar9 != 0x303b) {
            sVar2 = *readbytes;
            *readbytes = sVar2 + uVar11;
            if (maxbytes < sVar2 + uVar11) {
              ra_clear(answer);
              return false;
            }
            local_50 = (ushort *)((long)local_50 + uVar11);
          }
          _Var6 = uVar14 == 0;
          if (_Var6) {
            return _Var6;
          }
          uVar5 = uVar14;
          if ((int)uVar14 < 2) {
            uVar5 = 1;
          }
          uVar11 = 0;
          do {
            uVar1 = *(ushort *)(pcVar13 + uVar11 * 4 + 2);
            bVar15 = 0xfff < uVar1;
            if (uVar9 == 0x303b) {
              bVar15 = (1 << ((byte)uVar11 & 7) & (uint)(byte)local_40[uVar11 >> 3 & 0x1fffffff]) ==
                       0;
              bVar4 = !bVar15;
              bVar15 = bVar15 && 0xfff < uVar1;
            }
            else {
              bVar4 = false;
            }
            size = uVar1 + 1;
            if (bVar15) {
              sVar2 = *readbytes;
              *readbytes = sVar2 + 0x2000;
              if (maxbytes < sVar2 + 0x2000) {
LAB_00112d14:
                ra_clear_containers(answer);
                roaring_free(answer->containers);
                answer->keys = (uint16_t *)0x0;
                answer->typecodes = (uint8_t *)0x0;
                answer->size = 0;
                answer->allocation_size = 0;
                answer->containers = (void **)0x0;
LAB_00112e08:
                bVar15 = false;
              }
              else {
                container = bitset_container_create();
                if (container == (bitset_container_t *)0x0) goto LAB_00112dff;
                answer->size = answer->size + 1;
                iVar7 = bitset_container_read(size,container,(char *)local_50);
                local_50 = (ushort *)((long)local_50 + (long)iVar7);
                answer->containers[uVar11] = container;
                answer->typecodes[uVar11] = '\x01';
LAB_00112dfb:
                bVar15 = true;
              }
              if (!bVar15) goto LAB_00112e1b;
              bVar15 = true;
            }
            else {
              if (!bVar4) {
                uVar8 = (ulong)(uint)(size * 2) + *readbytes;
                *readbytes = uVar8;
                if (maxbytes < uVar8) goto LAB_00112d14;
                container_01 = array_container_create_given_capacity(size);
                if (container_01 == (array_container_t *)0x0) goto LAB_00112dff;
                answer->size = answer->size + 1;
                iVar7 = array_container_read(size,container_01,(char *)local_50);
                local_50 = (ushort *)((long)local_50 + (long)iVar7);
                answer->containers[uVar11] = container_01;
                answer->typecodes[uVar11] = '\x02';
                goto LAB_00112dfb;
              }
              uVar8 = *readbytes + 2;
              *readbytes = uVar8;
              if (uVar8 <= maxbytes) {
                uVar8 = uVar8 + (ulong)*local_50 * 4;
                *readbytes = uVar8;
                if ((uVar8 <= maxbytes) &&
                   (container_00 = run_container_create(), container_00 != (run_container_t *)0x0))
                {
                  answer->size = answer->size + 1;
                  iVar7 = run_container_read(size,container_00,(char *)local_50);
                  local_50 = (ushort *)((long)local_50 + (long)iVar7);
                  answer->containers[uVar11] = container_00;
                  answer->typecodes[uVar11] = '\x03';
                  goto LAB_00112dfb;
                }
LAB_00112dff:
                ra_clear(answer);
                goto LAB_00112e08;
              }
              ra_clear_containers(answer);
              roaring_free(answer->containers);
              answer->keys = (uint16_t *)0x0;
              answer->typecodes = (uint8_t *)0x0;
              answer->size = 0;
              answer->allocation_size = 0;
              answer->containers = (void **)0x0;
LAB_00112e1b:
              bVar15 = false;
            }
            if (!bVar15) {
              return _Var6;
            }
            uVar11 = uVar11 + 1;
            _Var6 = uVar14 <= uVar11;
            if (uVar5 == uVar11) {
              return _Var6;
            }
          } while( true );
        }
      }
    }
  }
  return false;
}

Assistant:

bool ra_portable_deserialize(roaring_array_t *answer, const char *buf,
                             const size_t maxbytes, size_t *readbytes) {
    *readbytes = sizeof(int32_t);  // for cookie
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading first 4 bytes.
        return false;
    }
    uint32_t cookie;
    memcpy(&cookie, buf, sizeof(int32_t));
    buf += sizeof(uint32_t);
    if ((cookie & 0xFFFF) != SERIAL_COOKIE &&
        cookie != SERIAL_COOKIE_NO_RUNCONTAINER) {
        // "I failed to find one of the right cookies.
        return false;
    }
    int32_t size;

    if ((cookie & 0xFFFF) == SERIAL_COOKIE)
        size = (cookie >> 16) + 1;
    else {
        *readbytes += sizeof(int32_t);
        if (*readbytes > maxbytes) {
            // Ran out of bytes while reading second part of the cookie.
            return false;
        }
        memcpy(&size, buf, sizeof(int32_t));
        buf += sizeof(uint32_t);
    }
    if (size < 0) {
        // You cannot have a negative number of containers, the data must be
        // corrupted.
        return false;
    }
    if (size > (1 << 16)) {
        // You cannot have so many containers, the data must be corrupted.
        return false;
    }
    const char *bitmapOfRunContainers = NULL;
    bool hasrun = (cookie & 0xFFFF) == SERIAL_COOKIE;
    if (hasrun) {
        int32_t s = (size + 7) / 8;
        *readbytes += s;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading run bitmap.
            return false;
        }
        bitmapOfRunContainers = buf;
        buf += s;
    }
    uint16_t *keyscards = (uint16_t *)buf;

    *readbytes += size * 2 * sizeof(uint16_t);
    if (*readbytes > maxbytes) {
        // Ran out of bytes while reading key-cardinality array.
        return false;
    }
    buf += size * 2 * sizeof(uint16_t);

    bool is_ok = ra_init_with_capacity(answer, size);
    if (!is_ok) {
        // Failed to allocate memory for roaring array. Bailing out.
        return false;
    }

    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k, sizeof(tmp));
        answer->keys[k] = tmp;
    }
    if ((!hasrun) || (size >= NO_OFFSET_THRESHOLD)) {
        *readbytes += size * 4;
        if (*readbytes > maxbytes) {  // data is corrupted?
            // Ran out of bytes while reading offsets.
            ra_clear(answer);  // we need to clear the containers already
                               // allocated, and the roaring array
            return false;
        }

        // skipping the offsets
        buf += size * 4;
    }
    // Reading the containers
    for (int32_t k = 0; k < size; ++k) {
        uint16_t tmp;
        memcpy(&tmp, keyscards + 2 * k + 1, sizeof(tmp));
        uint32_t thiscard = tmp + 1;
        bool isbitmap = (thiscard > DEFAULT_MAX_SIZE);
        bool isrun = false;
        if (hasrun) {
            if ((bitmapOfRunContainers[k / 8] & (1 << (k % 8))) != 0) {
                isbitmap = false;
                isrun = true;
            }
        }
        if (isbitmap) {
            // we check that the read is allowed
            size_t containersize =
                BITSET_CONTAINER_SIZE_IN_WORDS * sizeof(uint64_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            bitset_container_t *c = bitset_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a bitset container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += bitset_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = BITSET_CONTAINER_TYPE;
        } else if (isrun) {
            // we check that the read is allowed
            *readbytes += sizeof(uint16_t);
            if (*readbytes > maxbytes) {
                // Running out of bytes while reading a run container (header).
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            uint16_t n_runs;
            memcpy(&n_runs, buf, sizeof(uint16_t));
            size_t containersize = n_runs * sizeof(rle16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read

            run_container_t *c = run_container_create();
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for a run container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += run_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = RUN_CONTAINER_TYPE;
        } else {
            // we check that the read is allowed
            size_t containersize = thiscard * sizeof(uint16_t);
            *readbytes += containersize;
            if (*readbytes > maxbytes) {  // data is corrupted?
                // Running out of bytes while reading an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            // it is now safe to read
            array_container_t *c =
                array_container_create_given_capacity(thiscard);
            if (c == NULL) {  // memory allocation failure
                // Failed to allocate memory for an array container.
                ra_clear(answer);  // we need to clear the containers already
                                   // allocated, and the roaring array
                return false;
            }
            answer->size++;
            buf += array_container_read(thiscard, c, buf);
            answer->containers[k] = c;
            answer->typecodes[k] = ARRAY_CONTAINER_TYPE;
        }
    }
    return true;
}